

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

void linkFiles(string *typeName,uint32_t prevFileLink,uint32_t nextFileLink)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  string __str;
  fstream prevFile;
  uint32_t local_34c;
  long *local_348;
  undefined8 local_340;
  long local_338;
  undefined8 uStack_330;
  long *local_328;
  undefined8 local_320;
  long local_318;
  undefined8 uStack_310;
  ulong *local_308;
  uint local_300;
  undefined4 uStack_2fc;
  ulong local_2f8 [2];
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  string local_2c8;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298 [2];
  uint32_t local_284;
  string local_280;
  string local_260;
  undefined1 local_240 [16];
  char local_230 [512];
  
  local_34c = nextFileLink;
  local_284 = prevFileLink;
  if (prevFileLink != 0) {
    local_2a8 = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"data/","");
    pcVar1 = (typeName->_M_dataplus)._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar1,pcVar1 + typeName->_M_string_length);
    truncateName(&local_2c8,&local_260);
    uVar10 = 0xf;
    if (local_2a8 != local_298) {
      uVar10 = local_298[0];
    }
    if (uVar10 < local_2c8._M_string_length + local_2a0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        uVar11 = local_2c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_2c8._M_string_length + local_2a0) goto LAB_0010ad18;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_0010ad18:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_2c8._M_dataplus._M_p)
      ;
    }
    local_348 = &local_338;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_338 = *plVar6;
      uStack_330 = puVar5[3];
    }
    else {
      local_338 = *plVar6;
      local_348 = (long *)*puVar5;
    }
    local_340 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_348);
    puVar7 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar7) {
      local_2d8 = *puVar7;
      lStack_2d0 = plVar6[3];
      local_2e8 = &local_2d8;
    }
    else {
      local_2d8 = *puVar7;
      local_2e8 = (ulong *)*plVar6;
    }
    local_2e0 = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar4 = '\x01';
    if (9 < prevFileLink) {
      uVar8 = prevFileLink;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0010ae2c;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0010ae2c;
        }
        if (uVar8 < 10000) goto LAB_0010ae2c;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_0010ae2c:
    local_308 = local_2f8;
    std::__cxx11::string::_M_construct((ulong)&local_308,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,local_300,prevFileLink);
    uVar10 = CONCAT44(uStack_2fc,local_300) + local_2e0;
    uVar12 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar12 = local_2d8;
    }
    if (uVar12 < uVar10) {
      uVar12 = 0xf;
      if (local_308 != local_2f8) {
        uVar12 = local_2f8[0];
      }
      if (uVar12 < uVar10) goto LAB_0010ae96;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_2e8);
    }
    else {
LAB_0010ae96:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_308);
    }
    local_328 = &local_318;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_318 = *plVar6;
      uStack_310 = puVar5[3];
    }
    else {
      local_318 = *plVar6;
      local_328 = (long *)*puVar5;
    }
    local_320 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    std::fstream::fstream(local_240,(string *)&local_328,_S_out|_S_in|_S_bin);
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_308 != local_2f8) {
      operator_delete(local_308,local_2f8[0] + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    std::ostream::seekp(local_230,0x12,0);
    std::ostream::write(local_230,(long)&local_34c);
    std::fstream::close();
    std::fstream::~fstream(local_240);
  }
  if (local_34c == 0) {
    return;
  }
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"data/","");
  pcVar1 = (typeName->_M_dataplus)._M_p;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar1,pcVar1 + typeName->_M_string_length);
  truncateName(&local_2c8,&local_280);
  uVar10 = 0xf;
  if (local_2a8 != local_298) {
    uVar10 = local_298[0];
  }
  if (uVar10 < local_2c8._M_string_length + local_2a0) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      uVar11 = local_2c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_2c8._M_string_length + local_2a0) goto LAB_0010b0d8;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_0010b0d8:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_2c8._M_dataplus._M_p);
  }
  local_348 = &local_338;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_338 = *plVar6;
    uStack_330 = puVar5[3];
  }
  else {
    local_338 = *plVar6;
    local_348 = (long *)*puVar5;
  }
  local_340 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_348);
  uVar8 = local_34c;
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_2d8 = *puVar7;
    lStack_2d0 = plVar6[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar7;
    local_2e8 = (ulong *)*plVar6;
  }
  local_2e0 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar4 = '\x01';
  if (9 < local_34c) {
    uVar9 = local_34c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010b1f0;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010b1f0;
      }
      if (uVar9 < 10000) goto LAB_0010b1f0;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010b1f0:
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct((ulong)&local_308,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,local_300,uVar8);
  uVar10 = CONCAT44(uStack_2fc,local_300) + local_2e0;
  uVar12 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar12 = local_2d8;
  }
  if (uVar12 < uVar10) {
    uVar12 = 0xf;
    if (local_308 != local_2f8) {
      uVar12 = local_2f8[0];
    }
    if (uVar10 <= uVar12) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_2e8);
      goto LAB_0010b274;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_308);
LAB_0010b274:
  local_328 = &local_318;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_318 = *plVar6;
    uStack_310 = puVar5[3];
  }
  else {
    local_318 = *plVar6;
    local_328 = (long *)*puVar5;
  }
  local_320 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  std::fstream::fstream(local_240,(string *)&local_328,_S_out|_S_in|_S_bin);
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  std::ostream::seekp(local_230,0xe,0);
  std::ostream::write(local_230,(long)&local_284);
  std::fstream::close();
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void linkFiles(const string typeName, uint32_t prevFileLink, uint32_t nextFileLink) {
    if (prevFileLink != 0) {
        fstream prevFile(ROOT + truncateName(typeName) + INFIX + to_string(prevFileLink), INOUTBIN);

        prevFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE);
        prevFile.write((char *) &nextFileLink, LINK_TO_FILE);

        prevFile.close();
    }

    if (nextFileLink != 0) {
        fstream nextFile(ROOT + truncateName(typeName) + INFIX + to_string(nextFileLink), INOUTBIN);

        nextFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS);
        nextFile.write((char *) &prevFileLink, LINK_TO_FILE);

        nextFile.close();
    }
}